

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O0

uint Security::CalculateConstSize(Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  int32 iVar4;
  Int64ConstOpnd *pIVar5;
  long lVar6;
  IntConstOpnd *pIVar7;
  AddrOpnd *pAVar8;
  IndirOpnd *this;
  undefined4 *puVar9;
  uint local_44;
  IndirOpnd *indirOpnd;
  AddrOpnd *addrOpnd;
  IntConstOpnd *intConstOpnd_1;
  Int64ConstOpnd *intConstOpnd;
  Opnd *opnd_local;
  
  bVar2 = DontEncode(opnd);
  if (bVar2) {
    opnd_local._4_4_ = 0;
  }
  else {
    OVar3 = IR::Opnd::GetKind(opnd);
    switch(OVar3) {
    case OpndKindIntConst:
      pIVar7 = IR::Opnd::AsIntConstOpnd(opnd);
      lVar6 = IR::EncodableOpnd<long>::GetValue(&pIVar7->super_EncodableOpnd<long>);
      opnd_local._4_4_ = GetByteCount<long>(lVar6);
      break;
    case OpndKindInt64Const:
      pIVar5 = IR::Opnd::AsInt64ConstOpnd(opnd);
      lVar6 = IR::EncodableOpnd<long>::GetValue(&pIVar5->super_EncodableOpnd<long>);
      opnd_local._4_4_ = GetByteCount<long>(lVar6);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                         ,0x15e,"((0))","(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
      opnd_local._4_4_ = 0;
      break;
    case OpndKindAddr:
      pAVar8 = IR::Opnd::AsAddrOpnd(opnd);
      bVar2 = Js::TaggedInt::Is(pAVar8->m_address);
      if (bVar2) {
        iVar4 = Js::TaggedInt::ToInt32(pAVar8->m_address);
        local_44 = GetByteCount<int>(iVar4);
      }
      else {
        local_44 = GetByteCount<long>((long)pAVar8->m_address);
      }
      opnd_local._4_4_ = local_44;
      break;
    case OpndKindIndir:
      this = IR::Opnd::AsIndirOpnd(opnd);
      iVar4 = IR::IndirOpnd::GetOffset(this);
      opnd_local._4_4_ = GetByteCount<int>(iVar4);
    }
  }
  return opnd_local._4_4_;
}

Assistant:

uint
Security::CalculateConstSize(IR::Opnd *opnd)
{
    if (DontEncode(opnd))
    {
        return 0;
    }
    switch (opnd->GetKind())
    {
#if TARGET_64
    case IR::OpndKindInt64Const:
    {
        IR::Int64ConstOpnd *intConstOpnd = opnd->AsInt64ConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
#endif
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return Js::TaggedInt::Is(addrOpnd->m_address) ? GetByteCount(Js::TaggedInt::ToInt32(addrOpnd->m_address)) : GetByteCount((intptr_t)addrOpnd->m_address);
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();
        return GetByteCount(indirOpnd->GetOffset());
    }
    default:
        Assume(UNREACHED);
    }
    return 0;
}